

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int get_intersection(string *s1,string *s2)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  ulong local_40;
  size_t j;
  ulong uStack_30;
  bool result;
  size_t i;
  size_t l;
  string *s2_local;
  string *s1_local;
  
  uVar3 = std::__cxx11::string::length();
  lVar4 = std::__cxx11::string::find((string *)s2,(ulong)s1);
  s1_local._4_4_ = (int)uVar3;
  if (lVar4 == -1) {
    for (uStack_30 = 0; uStack_30 < uVar3; uStack_30 = uStack_30 + 1) {
      bVar2 = true;
      for (local_40 = uStack_30; local_40 < uVar3; local_40 = local_40 + 1) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)s1);
        cVar1 = *pcVar5;
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)s2);
        if (cVar1 != *pcVar5) {
          bVar2 = false;
          break;
        }
      }
      if (bVar2) {
        return s1_local._4_4_ - (int)uStack_30;
      }
    }
    s1_local._4_4_ = 0;
  }
  return s1_local._4_4_;
}

Assistant:

int get_intersection(const std::string& s1, const std::string& s2)
{
    size_t l = s1.length();
    if (std::string::npos != s2.find(s1))
    {
        return l;
    }
    for (size_t i = 0; i < l; i++)
    {
        bool result = true;
        for (size_t j = i; j < l; j++)
        {
            if (s1[j] != s2[j - i])
            {
                result = false;
                break;
            }
        }
        if (result)
        {
            return l - i;
        }
    }
    return 0;
}